

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

void __thiscall lsim::Simulator::run_until_stable(Simulator *this,size_t stable_ticks)

{
  timestamp_t tVar1;
  timestamp_t *ptVar2;
  bool bVar3;
  timestamp_t *ptVar4;
  long lVar5;
  long lVar6;
  timestamp_t *ptVar7;
  size_t sVar8;
  size_t sVar9;
  
  bVar3 = false;
  sVar9 = stable_ticks;
  do {
    if (bVar3) {
      return;
    }
    step(this);
    tVar1 = this->m_time;
    ptVar4 = (this->m_node_change_time).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (this->m_node_change_time).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar5 = (long)ptVar2 - (long)ptVar4;
    for (lVar6 = lVar5 >> 5; 0 < lVar6; lVar6 = lVar6 + -1) {
      ptVar7 = ptVar4;
      if (tVar1 == *ptVar4) goto LAB_001136ac;
      if (tVar1 == ptVar4[1]) {
        ptVar7 = ptVar4 + 1;
        goto LAB_001136ac;
      }
      if (tVar1 == ptVar4[2]) {
        ptVar7 = ptVar4 + 2;
        goto LAB_001136ac;
      }
      if (tVar1 == ptVar4[3]) {
        ptVar7 = ptVar4 + 3;
        goto LAB_001136ac;
      }
      ptVar4 = ptVar4 + 4;
      lVar5 = lVar5 + -0x20;
    }
    lVar5 = lVar5 >> 3;
    if (lVar5 == 1) {
LAB_00113690:
      ptVar7 = ptVar4;
      if (tVar1 != *ptVar4) {
        ptVar7 = ptVar2;
      }
    }
    else if (lVar5 == 2) {
LAB_00113687:
      ptVar7 = ptVar4;
      if (tVar1 != *ptVar4) {
        ptVar4 = ptVar4 + 1;
        goto LAB_00113690;
      }
    }
    else {
      ptVar7 = ptVar2;
      if ((lVar5 == 3) && (ptVar7 = ptVar4, tVar1 != *ptVar4)) {
        ptVar4 = ptVar4 + 1;
        goto LAB_00113687;
      }
    }
LAB_001136ac:
    sVar8 = sVar9 - 1;
    sVar9 = sVar8;
    if (ptVar7 != ptVar2) {
      sVar9 = stable_ticks;
    }
    bVar3 = ptVar7 == ptVar2 && sVar8 == 0;
  } while( true );
}

Assistant:

void Simulator::run_until_stable(size_t stable_ticks) {
    bool stop = false;
    auto remaining = stable_ticks;

    while (!stop) {
        step();

        bool stable = std::none_of(std::begin(m_node_change_time), std::end(m_node_change_time), 
                            [=] (auto t) {return t == m_time;}
        );

        if (!stable) {
            remaining = stable_ticks;
        } else {
            stop = --remaining == 0;
        }
    }
}